

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O1

Result_t * Kumu::CreateDirectoriesInPath(Result_t *__return_storage_ptr__,string *Path)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  _Node *p_Var4;
  ILogSink *this;
  int *piVar5;
  char *pcVar6;
  bool bVar7;
  string tmp_path;
  PathCompList_t PathComps;
  PathCompList_t TmpPathComps;
  string local_80;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (Path->_M_string_length == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = *(Path->_M_dataplus)._M_p == '/';
  }
  local_60._M_impl._M_node._M_size = 0;
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node._M_size = 0;
  local_60._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_60;
  local_60._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_60;
  local_48._M_impl._M_node.super__List_node_base._M_prev =
       local_48._M_impl._M_node.super__List_node_base._M_next;
  PathToComponents(Path,(PathCompList_t *)&local_60,'/');
  if (local_60._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_60) {
    do {
      p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &local_48,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_60._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
      local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_60,(iterator)local_60._M_impl._M_node.super__List_node_base._M_next);
      if (bVar7) {
        ComponentsToAbsolutePath(&local_80,(PathCompList_t *)&local_48,'/');
      }
      else {
        ComponentsToPath(&local_80,(PathCompList_t *)&local_48,'/');
      }
      bVar2 = PathIsDirectory(&local_80);
      if (!bVar2) {
        iVar3 = mkdir(local_80._M_dataplus._M_p,0x1ff);
        if (iVar3 != 0) {
          this = DefaultLogSink();
          _Var1._M_p = local_80._M_dataplus._M_p;
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          ILogSink::Error(this,"CreateDirectoriesInPath mkdir %s: %s\n",_Var1._M_p,pcVar6);
          Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_DIR_CREATE);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001159bf;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    } while (local_60._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_60)
    ;
  }
  Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_OK);
LAB_001159bf:
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_48);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Result_t
Kumu::CreateDirectoriesInPath(const std::string& Path)
{
  bool abs = PathIsAbsolute(Path);
  PathCompList_t PathComps, TmpPathComps;

  PathToComponents(Path, PathComps);

  while ( ! PathComps.empty() )
    {
      TmpPathComps.push_back(PathComps.front());
      PathComps.pop_front();
      std::string tmp_path = abs ? ComponentsToAbsolutePath(TmpPathComps) : ComponentsToPath(TmpPathComps);

      if ( ! PathIsDirectory(tmp_path) )
	{
#ifdef KM_WIN32
	  if ( _mkdir(tmp_path.c_str()) != 0 )
#else // KM_WIN32
	  if ( mkdir(tmp_path.c_str(), 0777) != 0 )
#endif // KM_WIN32
	    {
	      DefaultLogSink().Error("CreateDirectoriesInPath mkdir %s: %s\n",
				     tmp_path.c_str(), strerror(errno));
	      return RESULT_DIR_CREATE;
	    }
	}
    }

  return RESULT_OK;
}